

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

FieldSourceInfoBuilderPair * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::addMemberSchema
          (FieldSourceInfoBuilderPair *__return_storage_ptr__,MemberInfo *this)

{
  uint *puVar1;
  bool bVar2;
  Builder structNode;
  Fault f;
  DebugComparison<unsigned_int_&,_unsigned_int_&> local_a8;
  ListBuilder local_78;
  ListBuilder local_50;
  
  puVar1 = &this->childInitializedCount;
  local_a8.right = &this->childCount;
  bVar2 = this->childInitializedCount < this->childCount;
  local_a8.op.content.ptr = " < ";
  local_a8.op.content.size_ = 4;
  local_a8.result = bVar2;
  if (bVar2) {
    local_a8._32_8_ = *(undefined8 *)&(this->node)._builder.dataSize;
    local_a8.left = (uint *)(this->node)._builder.segment;
    local_a8.right = (uint *)(this->node)._builder.capTable;
    local_a8.op.content.ptr = (char *)(this->node)._builder.data;
    local_a8.op.content.size_ = (size_t)(this->node)._builder.pointers;
    bVar2 = capnp::schema::Node::Struct::Builder::hasFields((Builder *)&local_a8);
    if (bVar2) {
      capnp::schema::Node::Struct::Builder::getFields((Builder *)&local_78,(Builder *)&local_a8);
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)__return_storage_ptr__,&local_78,this->childInitializedCount);
      capnp::schema::Node::SourceInfo::Builder::getMembers((Builder *)&local_50,&this->sourceInfo);
    }
    else {
      if (this->parent != (MemberInfo *)0x0) {
        getSchema((Builder *)&local_78,this);
      }
      capnp::schema::Node::Struct::Builder::initFields
                ((Builder *)&local_78,(Builder *)&local_a8,this->childCount);
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)__return_storage_ptr__,&local_78,this->childInitializedCount);
      capnp::schema::Node::SourceInfo::Builder::initMembers
                ((Builder *)&local_50,&this->sourceInfo,this->childCount);
    }
    capnp::_::ListBuilder::getStructElement
              (&(__return_storage_ptr__->sourceInfo)._builder,&local_50,this->childInitializedCount)
    ;
    *puVar1 = *puVar1 + 1;
    return __return_storage_ptr__;
  }
  local_a8.left = puVar1;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&>
            ((Fault *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x474,FAILED,"childInitializedCount < childCount","_kjCondition,",&local_a8);
  kj::_::Debug::Fault::fatal((Fault *)&local_78);
}

Assistant:

addMemberSchema() {
      // Get the schema builder for the child member at the given index.  This lazily/dynamically
      // builds the builder tree.

      KJ_REQUIRE(childInitializedCount < childCount);

      auto structNode = node.getStruct();
      if (!structNode.hasFields()) {
        if (parent != nullptr) {
          getSchema();  // Make sure field exists in parent once the first child is added.
        }
        FieldSourceInfoBuilderPair result {
          structNode.initFields(childCount)[childInitializedCount],
          sourceInfo.initMembers(childCount)[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      } else {
        FieldSourceInfoBuilderPair result {
          structNode.getFields()[childInitializedCount],
          sourceInfo.getMembers()[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      }
    }